

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_initialize_face(REF_FACELIFT ref_facelift,REF_GEOM ref_geom)

{
  int iVar1;
  uint uVar2;
  REF_INT local_84;
  REF_INT local_80;
  int local_7c;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT item;
  REF_INT node;
  REF_INT face_geom;
  REF_INT edge_geom;
  REF_INT i;
  REF_DBL face_xyz [3];
  REF_DBL local_38;
  REF_DBL edge_xyz [3];
  REF_GEOM ref_geom_local;
  REF_FACELIFT ref_facelift_local;
  
  edge_xyz[2] = (REF_DBL)ref_geom;
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x133,"ref_facelift_initialize_face","requires indirect facelift");
    ref_facelift_local._4_4_ = 1;
  }
  else {
    for (node = 0; node < *(int *)((long)edge_xyz[2] + 4); node = node + 1) {
      if (*(int *)(*(long *)((long)edge_xyz[2] + 0x10) + (long)(node * 6) * 4) == 1) {
        uVar2 = ref_egads_eval((REF_GEOM)edge_xyz[2],node,&local_38,(REF_DBL *)0x0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x138,"ref_facelift_initialize_face",(ulong)uVar2,"eval edge");
          return uVar2;
        }
        iVar1 = *(int *)(*(long *)((long)edge_xyz[2] + 0x10) + (long)(node * 6 + 5) * 4);
        if ((iVar1 < 0) || (**(int **)((long)edge_xyz[2] + 0x60) <= iVar1)) {
          local_7c = -1;
        }
        else {
          local_7c = *(int *)(*(long *)(*(long *)((long)edge_xyz[2] + 0x60) + 8) + (long)iVar1 * 4);
        }
        ref_private_macro_code_rss_1 = local_7c;
        if (local_7c == -1) {
          local_80 = -1;
        }
        else {
          local_80 = *(REF_INT *)
                      (*(long *)(*(long *)((long)edge_xyz[2] + 0x60) + 0x10) + 4 +
                      (long)local_7c * 8);
        }
        item = local_80;
        while (ref_private_macro_code_rss_1 != -1) {
          if ((*(int *)(*(long *)((long)edge_xyz[2] + 0x10) + (long)(item * 6) * 4) == 2) &&
             (ref_facelift->strong_bc[item] == 0)) {
            uVar2 = ref_egads_eval((REF_GEOM)edge_xyz[2],item,(REF_DBL *)&edge_geom,(REF_DBL *)0x0);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x13d,"ref_facelift_initialize_face",(ulong)uVar2,"eval face");
              return uVar2;
            }
            ref_facelift->strong_bc[item] = 1;
            for (face_geom = 0; face_geom < 3; face_geom = face_geom + 1) {
              ref_facelift->displacement[face_geom + item * 3] =
                   edge_xyz[(long)face_geom + -1] - *(double *)(&edge_geom + (long)face_geom * 2);
            }
          }
          ref_private_macro_code_rss_1 =
               *(int *)(*(long *)(*(long *)((long)edge_xyz[2] + 0x60) + 0x10) +
                       (long)ref_private_macro_code_rss_1 * 8);
          if (ref_private_macro_code_rss_1 == -1) {
            local_84 = -1;
          }
          else {
            local_84 = *(REF_INT *)
                        (*(long *)(*(long *)((long)edge_xyz[2] + 0x60) + 0x10) + 4 +
                        (long)ref_private_macro_code_rss_1 * 8);
          }
          item = local_84;
        }
      }
    }
    for (face_geom = 0; face_geom < 1000; face_geom = face_geom + 1) {
      uVar2 = ref_facelift_solve_face(ref_facelift);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x148,"ref_facelift_initialize_face",(ulong)uVar2,"solve");
        return uVar2;
      }
    }
    ref_facelift_local._4_4_ = 0;
  }
  return ref_facelift_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_initialize_face(
    REF_FACELIFT ref_facelift, REF_GEOM ref_geom) {
  REF_DBL edge_xyz[3], face_xyz[3];
  REF_INT i, edge_geom, face_geom, node, item;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  /* also displace edge and face to geom nodes */

  each_ref_geom_edge(ref_geom, edge_geom) {
    RSS(ref_egads_eval(ref_geom, edge_geom, edge_xyz, NULL), "eval edge");
    node = ref_geom_node(ref_geom, edge_geom);
    each_ref_geom_having_node(ref_geom, node, item, face_geom) {
      if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom) &&
          !ref_facelift_strong_bc(ref_facelift, face_geom)) {
        RSS(ref_egads_eval(ref_geom, face_geom, face_xyz, NULL), "eval face");
        ref_facelift_strong_bc(ref_facelift, face_geom) = REF_TRUE;
        for (i = 0; i < 3; i++) {
          ref_facelift_displacement(ref_facelift, i, face_geom) =
              edge_xyz[i] - face_xyz[i];
        }
      }
    }
  }

  for (i = 0; i < 1000; i++)
    RSS(ref_facelift_solve_face(ref_facelift), "solve");

  return REF_SUCCESS;
}